

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_logger.c
# Opt level: O1

int SUNLogger_Create(void *comm,int output_rank,SUNLogger *logger_ptr)

{
  SUNLogger pSVar1;
  SUNHashMap __ptr;
  SUNHashMapKeyValue *pp_Var2;
  long lVar3;
  int iVar4;
  
  pSVar1 = (SUNLogger)malloc(0x60);
  *logger_ptr = pSVar1;
  iVar4 = -1;
  if (comm == (void *)0x0 && pSVar1 != (SUNLogger)0x0) {
    iVar4 = 0;
    pSVar1->commptr = (void *)0x0;
    pSVar1->output_rank = output_rank;
    __ptr = (SUNHashMap)malloc(0x10);
    pSVar1->debug_fp = (FILE *)0x0;
    pSVar1->warning_fp = (FILE *)0x0;
    pSVar1->info_fp = (FILE *)0x0;
    pSVar1->error_fp = (FILE *)0x0;
    pSVar1->content = (void *)0x0;
    pSVar1->queuemsg =
         (_func_int_SUNLogger_SUNLogLevel_char_ptr_char_ptr_char_ptr___va_list_tag_ptr *)0x0;
    pSVar1->flush = (_func_int_SUNLogger_SUNLogLevel *)0x0;
    pSVar1->destroy = (_func_int_SUNLogger_ptr *)0x0;
    pSVar1->filenames = __ptr;
    __ptr->size = 0;
    __ptr->max_size = 8;
    __ptr->buckets = (SUNHashMapKeyValue *)0x0;
    pp_Var2 = (SUNHashMapKeyValue *)malloc(0x40);
    __ptr->buckets = pp_Var2;
    if (pp_Var2 == (SUNHashMapKeyValue *)0x0) {
      free(__ptr);
    }
    else {
      iVar4 = 0;
      lVar3 = 0;
      do {
        pSVar1->filenames->buckets[lVar3] = (SUNHashMapKeyValue)0x0;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 8);
    }
  }
  return iVar4;
}

Assistant:

int SUNLogger_Create(void* comm, int output_rank, SUNLogger* logger_ptr)
{
  SUNLogger logger = NULL;

  *logger_ptr = logger = (SUNLogger)malloc(sizeof(struct SUNLogger_));
  if (logger == NULL)
  {
    return -1;
  }

  /* Attach the comm, duplicating it if MPI is used. */
#ifdef SUNDIALS_LOGGING_ENABLE_MPI
  logger->commptr = NULL;
  if (comm != NULL)
  {
    logger->commptr = malloc(sizeof(MPI_Comm));
    MPI_Comm_dup(*((MPI_Comm*) comm), (MPI_Comm*) logger->commptr);
  }
#else
  if (comm != NULL)
  {
    return -1;
  }
  logger->commptr = NULL;
#endif
  logger->output_rank = output_rank;
  logger->content     = NULL;

  /* use default routines */
  logger->queuemsg = NULL;
  logger->flush    = NULL;
  logger->destroy  = NULL;

  /* set the output file handles */
  logger->filenames  = NULL;
  logger->error_fp   = NULL;
  logger->warning_fp = NULL;
  logger->debug_fp   = NULL;
  logger->info_fp    = NULL;
  if (sunLoggerIsOutputRank(logger, NULL))
  {
    /* We store the FILE* in a hash map so that we can ensure
       that we do not open a file twice if the same file is used
       for multiple output levels */
    SUNHashMap_New(SUN_MAX_LOGFILE_HANDLES_, &logger->filenames);
  }

  return 0;
}